

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_TVFS.cpp
# Opt level: O2

DWORD __thiscall
TRootHandler_TVFS::ParsePathFileTable
          (TRootHandler_TVFS *this,TCascStorage *hs,TVFS_DIRECTORY_HEADER *DirHeader,
          PATH_BUFFER *PathBuffer,LPBYTE pbPathTablePtr,LPBYTE pbPathTableEnd)

{
  char *pcVar1;
  DWORD DVar2;
  int iVar3;
  LPBYTE pbPathTablePtr_00;
  DWORD dwSpanSize;
  TCascStorage *local_c0;
  TVFS_DIRECTORY_HEADER *local_b8;
  CASC_FILE_TREE *local_b0;
  char *local_a8;
  TVFS_PATH_TABLE_ENTRY PathEntry;
  ENCODED_KEY EKey;
  TVFS_DIRECTORY_HEADER SubHeader;
  
  local_a8 = PathBuffer->szPtr;
  dwSpanSize = 0;
  EKey.Value[0] = '\0';
  EKey.Value[1] = '\0';
  EKey.Value[2] = '\0';
  EKey.Value[3] = '\0';
  EKey.Value[4] = '\0';
  EKey.Value[5] = '\0';
  EKey.Value[6] = '\0';
  EKey.Value[7] = '\0';
  EKey.Value[8] = '\0';
  EKey.Value[9] = '\0';
  EKey.Value[10] = '\0';
  EKey.Value[0xb] = '\0';
  EKey.Value[0xc] = '\0';
  EKey.Value[0xd] = '\0';
  EKey.Value[0xe] = '\0';
  EKey.Value[0xf] = '\0';
  local_b0 = &(this->super_TFileTreeRoot).FileTree;
  local_c0 = hs;
  local_b8 = DirHeader;
  do {
    do {
      if (pbPathTableEnd <= pbPathTablePtr) {
        return 0;
      }
      pbPathTablePtr_00 = CapturePathEntry(this,&PathEntry,pbPathTablePtr,pbPathTableEnd);
      if (pbPathTablePtr_00 == (LPBYTE)0x0) {
        return 1000;
      }
      PathBuffer_AppendNode(this,PathBuffer,&PathEntry);
      pbPathTablePtr = pbPathTablePtr_00;
    } while (((byte)PathEntry.NodeFlags & 4) == 0);
    if ((int)PathEntry.NodeValue < 0) {
      if ((PathEntry.NodeValue & 0x7fffffff) < 4) {
        __assert_fail("(PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) >= sizeof(DWORD)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_TVFS.cpp"
                      ,0x1c2,
                      "DWORD TRootHandler_TVFS::ParsePathFileTable(TCascStorage *, TVFS_DIRECTORY_HEADER &, PATH_BUFFER &, LPBYTE, LPBYTE)"
                     );
      }
      pbPathTablePtr = pbPathTablePtr_00 + ((ulong)(PathEntry.NodeValue & 0x7fffffff) - 4);
      DVar2 = ParsePathFileTable(this,local_c0,local_b8,PathBuffer,pbPathTablePtr_00,pbPathTablePtr)
      ;
      if (DVar2 != 0) {
        return DVar2;
      }
    }
    else {
      DVar2 = CaptureVfsSpanEntries(this,local_b8,&EKey,&dwSpanSize,PathEntry.NodeValue);
      if (DVar2 != 0) {
        return DVar2;
      }
      iVar3 = IsVfsSubDirectory(this,local_c0,local_b8,&SubHeader,&EKey,dwSpanSize);
      if (iVar3 == 0) {
        pcVar1 = PathBuffer->szPtr;
        if (pcVar1 < PathBuffer->szEnd) {
          PathBuffer->szPtr = pcVar1 + 1;
          *pcVar1 = ':';
          *PathBuffer->szPtr = '\0';
        }
        CASC_FILE_TREE::Insert(local_b0,&EKey,PathBuffer->szBegin,0xffffffff,dwSpanSize,0xffffffff);
        ParseDirectoryData(this,local_c0,&SubHeader,PathBuffer);
        free(SubHeader.pbDirectoryData);
      }
      else {
        CASC_FILE_TREE::Insert(local_b0,&EKey,PathBuffer->szBegin,0xffffffff,dwSpanSize,0xffffffff);
      }
    }
    PathBuffer->szPtr = local_a8;
    *local_a8 = '\0';
  } while( true );
}

Assistant:

DWORD ParsePathFileTable(TCascStorage * hs, TVFS_DIRECTORY_HEADER & DirHeader, PATH_BUFFER & PathBuffer, LPBYTE pbPathTablePtr, LPBYTE pbPathTableEnd)
    {
        TVFS_DIRECTORY_HEADER SubHeader;
        TVFS_PATH_TABLE_ENTRY PathEntry;
        ENCODED_KEY EKey;
        char * szSavePathPtr = PathBuffer.szPtr;
        DWORD dwSpanSize = 0;
        int nError;

        // Prepare the EKey structure to be filled with zeros
        memset(&EKey, 0, sizeof(ENCODED_KEY));

        // Parse the file table
        while(pbPathTablePtr < pbPathTableEnd)
        {
            // Capture the single path table entry
            pbPathTablePtr = CapturePathEntry(PathEntry, pbPathTablePtr, pbPathTableEnd);
            if(pbPathTablePtr == NULL)
                return ERROR_BAD_FORMAT;

            // Append the node name to the total path. Also add backslash, if it's a folder
            PathBuffer_AppendNode(PathBuffer, PathEntry);

            // Folder component
            if (PathEntry.NodeFlags & TVFS_PTE_NODE_VALUE)
            {
                // If the TVFS_FOLDER_NODE is set, then the path node is a directory,
                // with its data immediately following the path node. Lower 31 bits of NodeValue
                // contain the length of the directory (including the NodeValue!)
                if (PathEntry.NodeValue & TVFS_FOLDER_NODE)
                {
                    LPBYTE pbDirectoryEnd = pbPathTablePtr + (PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) - sizeof(DWORD);

                    // Check the available data
                    assert((PathEntry.NodeValue & TVFS_FOLDER_SIZE_MASK) >= sizeof(DWORD));

                    // Recursively call the folder parser on the same file
                    nError = ParsePathFileTable(hs, DirHeader, PathBuffer, pbPathTablePtr, pbDirectoryEnd);
                    if (nError != ERROR_SUCCESS)
                        return nError;

                    // Skip the directory data
                    pbPathTablePtr = pbDirectoryEnd;
                }
                else
                {
                    // Capture the VFS and Container Table Entry in order to get the file EKey
                    nError = CaptureVfsSpanEntries(DirHeader, &EKey, &dwSpanSize, PathEntry.NodeValue);
                    if (nError != ERROR_SUCCESS)
                        return nError;

                    // We need to check whether this is another TVFS directory file
                    if (IsVfsSubDirectory(hs, DirHeader, SubHeader, EKey, dwSpanSize) == ERROR_SUCCESS)
                    {
                        // Add colon (':')
                        PathBuffer_AddChar(PathBuffer, ':');

                        // Insert the file to the file tree
                        FileTree.Insert(&EKey, PathBuffer.szBegin, CASC_INVALID_ID, dwSpanSize);

                        ParseDirectoryData(hs, SubHeader, PathBuffer);
                        CASC_FREE(SubHeader.pbDirectoryData);
                    }
                    else
                    {
//                      if (fp != NULL)
//                      {
//                          fwrite(PathBuffer.szBegin, 1, (PathBuffer.szPtr - PathBuffer.szBegin), fp);
//                          fprintf(fp, "\n");
//                      }

                        // Insert the file to the file tree
                        FileTree.Insert(&EKey, PathBuffer.szBegin, CASC_INVALID_ID, dwSpanSize);
                    }
                }

                // Reset the position of the path buffer
                PathBuffer.szPtr = szSavePathPtr;
                PathBuffer.szPtr[0] = 0;
            }
        }

        // Return the total number of entries
        return ERROR_SUCCESS;
    }